

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O0

void copy<unsigned_char*,128u,unsigned_char**>(vector_block<unsigned_char_*,_128U> *v,uchar **dst)

{
  uchar **__first;
  bool bVar1;
  size_type sVar2;
  const_reference pppuVar3;
  ulong local_20;
  size_t i;
  uchar **dst_local;
  vector_block<unsigned_char_*,_128U> *v_local;
  
  bVar1 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::empty(&v->_index_block);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("not v._index_block.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                  ,0x5b,
                  "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 128U, OutputIterator = unsigned char **]"
                 );
  }
  local_20 = 1;
  i = (size_t)dst;
  while( true ) {
    sVar2 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::size(&v->_index_block)
    ;
    if (sVar2 <= local_20) break;
    pppuVar3 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                         (&v->_index_block,local_20 - 1);
    __first = *pppuVar3;
    pppuVar3 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                         (&v->_index_block,local_20 - 1);
    std::copy<unsigned_char**,unsigned_char**>(__first,*pppuVar3 + 0x80,(uchar **)i);
    i = i + 0x400;
    local_20 = local_20 + 1;
  }
  pppuVar3 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                       (&v->_index_block);
  std::copy<unsigned_char**,unsigned_char**>(*pppuVar3,v->_insertpos,(uchar **)i);
  return;
}

Assistant:

static inline void
copy(const vector_block<T, B>& v, OutputIterator dst)
{
	assert(not v._index_block.empty());
	for (size_t i=1; i < v._index_block.size(); ++i) {
		std::copy(v._index_block[i-1],
		          v._index_block[i-1]+B,
		          dst);
		dst += B;
	}
	std::copy(v._index_block.back(), v._insertpos, dst);
}